

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockSingleNestedStructArrayCase::init
          (BlockSingleNestedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  StructType *pSVar1;
  BufferBlock *pBVar2;
  BlockSingleNestedStructArrayCase *extraout_RAX;
  VarType local_258;
  BufferVar local_240;
  VarType local_200;
  VarType local_1e8;
  BufferVar local_1d0;
  VarType local_190;
  BufferVar local_178;
  VarType local_138;
  BufferVar local_120;
  BufferBlock *local_e0;
  BufferBlock *block;
  VarType local_c0;
  VarType local_a8;
  StructType *local_90;
  StructType *typeT;
  VarType local_70;
  VarType local_58;
  VarType local_30;
  StructType *local_18;
  StructType *typeS;
  BlockSingleNestedStructArrayCase *this_local;
  
  typeS = (StructType *)this;
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"S");
  local_18 = pSVar1;
  glu::VarType::VarType(&local_30,TYPE_INT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"a",&local_30);
  glu::VarType::~VarType(&local_30);
  pSVar1 = local_18;
  glu::VarType::VarType(&local_70,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType(&local_58,&local_70,4);
  glu::StructType::addMember(pSVar1,"b",&local_58);
  glu::VarType::~VarType(&local_58);
  glu::VarType::~VarType(&local_70);
  pSVar1 = local_18;
  glu::VarType::VarType((VarType *)&typeT,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(pSVar1,"c",(VarType *)&typeT);
  glu::VarType::~VarType((VarType *)&typeT);
  pSVar1 = bb::ShaderInterface::allocStruct(&(this->super_SSBOLayoutCase).m_interface,"T");
  local_90 = pSVar1;
  glu::VarType::VarType(&local_a8,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  glu::StructType::addMember(pSVar1,"a",&local_a8);
  glu::VarType::~VarType(&local_a8);
  pSVar1 = local_90;
  glu::VarType::VarType((VarType *)&block,local_18);
  glu::VarType::VarType(&local_c0,(VarType *)&block,3);
  glu::StructType::addMember(pSVar1,"b",&local_c0);
  glu::VarType::~VarType(&local_c0);
  glu::VarType::~VarType((VarType *)&block);
  pBVar2 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"Block");
  local_e0 = pBVar2;
  glu::VarType::VarType(&local_138,local_18);
  bb::BufferVar::BufferVar(&local_120,"s",&local_138,0x1000);
  bb::BufferBlock::addMember(pBVar2,&local_120);
  bb::BufferVar::~BufferVar(&local_120);
  glu::VarType::~VarType(&local_138);
  pBVar2 = local_e0;
  glu::VarType::VarType(&local_190,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_178,"v",&local_190,0);
  bb::BufferBlock::addMember(pBVar2,&local_178);
  bb::BufferVar::~BufferVar(&local_178);
  glu::VarType::~VarType(&local_190);
  pBVar2 = local_e0;
  glu::VarType::VarType(&local_200,local_90);
  glu::VarType::VarType(&local_1e8,&local_200,2);
  bb::BufferVar::BufferVar(&local_1d0,"t",&local_1e8,0x800);
  bb::BufferBlock::addMember(pBVar2,&local_1d0);
  bb::BufferVar::~BufferVar(&local_1d0);
  glu::VarType::~VarType(&local_1e8);
  glu::VarType::~VarType(&local_200);
  pBVar2 = local_e0;
  glu::VarType::VarType(&local_258,TYPE_UINT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_240,"u",&local_258,0x1800);
  bb::BufferBlock::addMember(pBVar2,&local_240);
  bb::BufferVar::~BufferVar(&local_240);
  glu::VarType::~VarType(&local_258);
  bb::BufferBlock::setFlags(local_e0,this->m_layoutFlags);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setInstanceName(local_e0,"block");
    bb::BufferBlock::setArraySize(local_e0,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, glu::PRECISION_HIGHP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP));
		typeT.addMember("b", VarType(VarType(&typeS), 3));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("s", VarType(&typeS), ACCESS_WRITE));
		block.addMember(BufferVar("v", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("t", VarType(VarType(&typeT), 2), ACCESS_READ));
		block.addMember(BufferVar("u", VarType(glu::TYPE_UINT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}
	}